

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfw.cpp
# Opt level: O0

void ImGui_ImplGlfw_UpdateGamepads(void)

{
  float *pfVar1;
  uchar *puVar2;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float v_3;
  float v_2;
  float v_1;
  float v;
  uchar *buttons;
  float *axes;
  int buttons_count;
  int axes_count;
  ImGuiIO *io;
  
  _buttons_count = ImGui::GetIO();
  memset(_buttons_count->NavInputs,0,0x54);
  if ((_buttons_count->ConfigFlags & 2U) != 0) {
    axes._4_4_ = 0;
    axes._0_4_ = 0;
    pfVar1 = glfwGetJoystickAxes(0,(int *)((long)&axes + 4));
    puVar2 = glfwGetJoystickButtons(0,(int *)&axes);
    if ((0 < (int)axes) && (*puVar2 == '\x01')) {
      _buttons_count->NavInputs[0] = 1.0;
    }
    if ((1 < (int)axes) && (puVar2[1] == '\x01')) {
      _buttons_count->NavInputs[1] = 1.0;
    }
    if ((2 < (int)axes) && (puVar2[2] == '\x01')) {
      _buttons_count->NavInputs[3] = 1.0;
    }
    if ((3 < (int)axes) && (puVar2[3] == '\x01')) {
      _buttons_count->NavInputs[2] = 1.0;
    }
    if ((0xd < (int)axes) && (puVar2[0xd] == '\x01')) {
      _buttons_count->NavInputs[4] = 1.0;
    }
    if ((0xb < (int)axes) && (puVar2[0xb] == '\x01')) {
      _buttons_count->NavInputs[5] = 1.0;
    }
    if ((10 < (int)axes) && (puVar2[10] == '\x01')) {
      _buttons_count->NavInputs[6] = 1.0;
    }
    if ((0xc < (int)axes) && (puVar2[0xc] == '\x01')) {
      _buttons_count->NavInputs[7] = 1.0;
    }
    if ((4 < (int)axes) && (puVar2[4] == '\x01')) {
      _buttons_count->NavInputs[0xc] = 1.0;
    }
    if ((5 < (int)axes) && (puVar2[5] == '\x01')) {
      _buttons_count->NavInputs[0xd] = 1.0;
    }
    if ((4 < (int)axes) && (puVar2[4] == '\x01')) {
      _buttons_count->NavInputs[0xe] = 1.0;
    }
    if ((5 < (int)axes) && (puVar2[5] == '\x01')) {
      _buttons_count->NavInputs[0xf] = 1.0;
    }
    if (axes._4_4_ < 1) {
      local_3c = -0.3;
    }
    else {
      local_3c = *pfVar1;
    }
    v_2 = (local_3c - -0.3) / -0.59999996;
    if (1.0 < v_2) {
      v_2 = 1.0;
    }
    if (_buttons_count->NavInputs[8] < v_2) {
      _buttons_count->NavInputs[8] = v_2;
    }
    if (axes._4_4_ < 1) {
      local_40 = 0.3;
    }
    else {
      local_40 = *pfVar1;
    }
    v_3 = (local_40 - 0.3) / 0.59999996;
    if (1.0 < v_3) {
      v_3 = 1.0;
    }
    if (_buttons_count->NavInputs[9] < v_3) {
      _buttons_count->NavInputs[9] = v_3;
    }
    if (axes._4_4_ < 2) {
      local_44 = 0.3;
    }
    else {
      local_44 = pfVar1[1];
    }
    local_34 = (local_44 - 0.3) / 0.59999996;
    if (1.0 < local_34) {
      local_34 = 1.0;
    }
    if (_buttons_count->NavInputs[10] < local_34) {
      _buttons_count->NavInputs[10] = local_34;
    }
    if (axes._4_4_ < 2) {
      local_48 = -0.3;
    }
    else {
      local_48 = pfVar1[1];
    }
    local_38 = (local_48 - -0.3) / -0.59999996;
    if (1.0 < local_38) {
      local_38 = 1.0;
    }
    if (_buttons_count->NavInputs[0xb] < local_38) {
      _buttons_count->NavInputs[0xb] = local_38;
    }
    if ((axes._4_4_ < 1) || ((int)axes < 1)) {
      _buttons_count->BackendFlags = _buttons_count->BackendFlags & 0xfffffffe;
    }
    else {
      _buttons_count->BackendFlags = _buttons_count->BackendFlags | 1;
    }
  }
  return;
}

Assistant:

static void ImGui_ImplGlfw_UpdateGamepads()
{
    ImGuiIO& io = ImGui::GetIO();
    memset(io.NavInputs, 0, sizeof(io.NavInputs));
    if ((io.ConfigFlags & ImGuiConfigFlags_NavEnableGamepad) == 0)
        return;

    // Update gamepad inputs
    #define MAP_BUTTON(NAV_NO, BUTTON_NO)       { if (buttons_count > BUTTON_NO && buttons[BUTTON_NO] == GLFW_PRESS) io.NavInputs[NAV_NO] = 1.0f; }
    #define MAP_ANALOG(NAV_NO, AXIS_NO, V0, V1) { float v = (axes_count > AXIS_NO) ? axes[AXIS_NO] : V0; v = (v - V0) / (V1 - V0); if (v > 1.0f) v = 1.0f; if (io.NavInputs[NAV_NO] < v) io.NavInputs[NAV_NO] = v; }
    int axes_count = 0, buttons_count = 0;
    const float* axes = glfwGetJoystickAxes(GLFW_JOYSTICK_1, &axes_count);
    const unsigned char* buttons = glfwGetJoystickButtons(GLFW_JOYSTICK_1, &buttons_count);
    MAP_BUTTON(ImGuiNavInput_Activate,   0);     // Cross / A
    MAP_BUTTON(ImGuiNavInput_Cancel,     1);     // Circle / B
    MAP_BUTTON(ImGuiNavInput_Menu,       2);     // Square / X
    MAP_BUTTON(ImGuiNavInput_Input,      3);     // Triangle / Y
    MAP_BUTTON(ImGuiNavInput_DpadLeft,   13);    // D-Pad Left
    MAP_BUTTON(ImGuiNavInput_DpadRight,  11);    // D-Pad Right
    MAP_BUTTON(ImGuiNavInput_DpadUp,     10);    // D-Pad Up
    MAP_BUTTON(ImGuiNavInput_DpadDown,   12);    // D-Pad Down
    MAP_BUTTON(ImGuiNavInput_FocusPrev,  4);     // L1 / LB
    MAP_BUTTON(ImGuiNavInput_FocusNext,  5);     // R1 / RB
    MAP_BUTTON(ImGuiNavInput_TweakSlow,  4);     // L1 / LB
    MAP_BUTTON(ImGuiNavInput_TweakFast,  5);     // R1 / RB
    MAP_ANALOG(ImGuiNavInput_LStickLeft, 0,  -0.3f,  -0.9f);
    MAP_ANALOG(ImGuiNavInput_LStickRight,0,  +0.3f,  +0.9f);
    MAP_ANALOG(ImGuiNavInput_LStickUp,   1,  +0.3f,  +0.9f);
    MAP_ANALOG(ImGuiNavInput_LStickDown, 1,  -0.3f,  -0.9f);
    #undef MAP_BUTTON
    #undef MAP_ANALOG
    if (axes_count > 0 && buttons_count > 0)
        io.BackendFlags |= ImGuiBackendFlags_HasGamepad;
    else
        io.BackendFlags &= ~ImGuiBackendFlags_HasGamepad;
}